

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

_Bool extent_commit_impl(tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,
                        extent_t *extent,size_t offset,size_t length,_Bool growing_retained)

{
  byte bVar1;
  extent_hooks_t *peVar2;
  
  extent_hooks_assure_initialized(arena,r_extent_hooks);
  peVar2 = &extent_hooks_default;
  if (*r_extent_hooks != &extent_hooks_default) {
    extent_hook_pre_reentrancy(tsdn,arena);
    peVar2 = *r_extent_hooks;
  }
  if ((code *)peVar2->commit == (code *)0x0) {
    bVar1 = 1;
  }
  else {
    bVar1 = (*(code *)peVar2->commit)
                      (peVar2,(ulong)extent->e_addr & 0xfffffffffffff000,
                       (extent->field_2).e_size_esn & 0xfffffffffffff000,offset,length,
                       arena->base->ind);
    peVar2 = *r_extent_hooks;
  }
  if (peVar2 != &extent_hooks_default) {
    extent_hook_post_reentrancy(tsdn);
  }
  extent->e_bits =
       (ulong)(((byte)(~bVar1 | (byte)(extent->e_bits >> 0xd)) & 1) << 0xd) |
       extent->e_bits & 0xffffffffffffdfff;
  return (_Bool)bVar1;
}

Assistant:

static bool
extent_commit_impl(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, extent_t *extent, size_t offset,
    size_t length, bool growing_retained) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, growing_retained ? 1 : 0);

	extent_hooks_assure_initialized(arena, r_extent_hooks);
	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_pre_reentrancy(tsdn, arena);
	}
	bool err = ((*r_extent_hooks)->commit == NULL ||
	    (*r_extent_hooks)->commit(*r_extent_hooks, extent_base_get(extent),
	    extent_size_get(extent), offset, length, arena_ind_get(arena)));
	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_post_reentrancy(tsdn);
	}
	extent_committed_set(extent, extent_committed_get(extent) || !err);
	return err;
}